

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

void __thiscall
BVSparse<Memory::JitArenaAllocator>::ClearAll(BVSparse<Memory::JitArenaAllocator> *this)

{
  Type pBVar1;
  BVSparseNode *local_20;
  BVSparseNode *node;
  BVSparseNode *nextNode;
  BVSparse<Memory::JitArenaAllocator> *this_local;
  
  local_20 = this->head;
  while (local_20 != (BVSparseNode *)0x0) {
    pBVar1 = local_20->next;
    QueueInFreeList(this,local_20);
    local_20 = pBVar1;
  }
  this->head = (Type_conflict)0x0;
  this->lastFoundIndex = (Type_conflict)0x0;
  this->lastUsedNodePrevNextField = &this->head;
  return;
}

Assistant:

void
BVSparse<TAllocator>::ClearAll()
{
    BVSparseNode* nextNode;
    for(BVSparseNode * node = this->head; node != 0 ; node = nextNode)
    {
        nextNode = node->next;
        QueueInFreeList(node);
    }
    this->head = nullptr;
    this->lastFoundIndex = nullptr;
    this->lastUsedNodePrevNextField = &this->head;
}